

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O1

void __thiscall
ScriptUtil_CreateMultisigRedeemScriptTest_Test::TestBody
          (ScriptUtil_CreateMultisigRedeemScriptTest_Test *this)

{
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *this_00;
  void *pvVar1;
  pointer pcVar2;
  undefined8 lhs;
  bool bVar3;
  long lVar4;
  char *message;
  undefined1 *puVar5;
  pointer pMVar6;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::Pubkey> __l_01;
  initializer_list<cfd::core::Pubkey> __l_02;
  initializer_list<cfd::core::Pubkey> __l_03;
  initializer_list<cfd::core::Pubkey> __l_04;
  initializer_list<MultisigTestVector> __l_05;
  AssertionResult gtest_ar;
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> test_vectors;
  AssertionResult gtest_ar_1;
  MultisigTestVector test_vector;
  Script actual;
  allocator_type local_104f;
  allocator_type local_104e;
  allocator_type local_104d;
  allocator_type local_104c;
  allocator_type local_104b;
  allocator_type local_104a;
  allocator_type local_1049;
  Pubkey local_1048;
  Pubkey local_1030;
  Pubkey local_1018;
  undefined1 *local_1000 [2];
  undefined1 local_ff0 [16];
  undefined1 *local_fe0 [2];
  undefined1 local_fd0 [16];
  undefined1 *local_fc0 [2];
  undefined1 local_fb0 [16];
  undefined1 *local_fa0 [2];
  undefined1 local_f90 [16];
  undefined1 *local_f80 [2];
  undefined1 local_f70 [16];
  undefined1 *local_f60 [2];
  undefined1 local_f50 [16];
  undefined1 *local_f40 [2];
  undefined1 local_f30 [16];
  undefined1 *local_f20 [2];
  undefined1 local_f10 [16];
  undefined1 *local_f00 [2];
  undefined1 local_ef0 [16];
  undefined1 *local_ee0 [2];
  undefined1 local_ed0 [16];
  undefined1 *local_ec0 [2];
  undefined1 local_eb0 [16];
  undefined1 *local_ea0 [2];
  undefined1 local_e90 [16];
  undefined1 *local_e80 [2];
  undefined1 local_e70 [16];
  undefined1 *local_e60 [2];
  undefined1 local_e50 [16];
  undefined1 *local_e40 [2];
  undefined1 local_e30 [16];
  undefined1 *local_e20 [2];
  undefined1 local_e10 [16];
  undefined1 *local_e00 [2];
  undefined1 local_df0 [16];
  undefined1 *local_de0 [2];
  undefined1 local_dd0 [16];
  undefined1 *local_dc0 [2];
  undefined1 local_db0 [16];
  undefined1 *local_da0 [2];
  undefined1 local_d90 [16];
  undefined1 *local_d80 [2];
  undefined1 local_d70 [16];
  undefined1 *local_d60 [2];
  undefined1 local_d50 [16];
  undefined1 *local_d40 [2];
  undefined1 local_d30 [16];
  undefined1 *local_d20 [2];
  undefined1 local_d10 [16];
  undefined1 *local_d00 [2];
  undefined1 local_cf0 [16];
  undefined1 *local_ce0 [2];
  undefined1 local_cd0 [16];
  undefined1 *local_cc0 [2];
  undefined1 local_cb0 [16];
  undefined1 *local_ca0 [2];
  undefined1 local_c90 [16];
  undefined1 *local_c80 [2];
  undefined1 local_c70 [16];
  undefined1 *local_c60 [2];
  undefined1 local_c50 [16];
  undefined1 *local_c40 [2];
  undefined1 local_c30 [16];
  undefined1 *local_c20 [2];
  undefined1 local_c10 [16];
  undefined1 *local_c00 [2];
  undefined1 local_bf0 [16];
  undefined1 *local_be0 [2];
  undefined1 local_bd0 [16];
  undefined1 *local_bc0 [2];
  undefined1 local_bb0 [16];
  undefined1 *local_ba0 [2];
  undefined1 local_b90 [16];
  undefined1 *local_b80 [2];
  undefined1 local_b70 [16];
  undefined1 *local_b60 [2];
  undefined1 local_b50 [16];
  undefined1 *local_b40 [2];
  undefined1 local_b30 [16];
  undefined1 *local_b20 [2];
  undefined1 local_b10 [16];
  undefined1 *local_b00 [2];
  undefined1 local_af0 [16];
  undefined1 *local_ae0 [2];
  undefined1 local_ad0 [16];
  undefined1 *local_ac0 [2];
  undefined1 local_ab0 [16];
  undefined1 *local_aa0 [2];
  undefined1 local_a90 [16];
  undefined1 *local_a80 [2];
  undefined1 local_a70 [16];
  undefined1 *local_a60 [2];
  undefined1 local_a50 [16];
  undefined1 *local_a40 [2];
  undefined1 local_a30 [16];
  undefined1 *local_a20 [2];
  undefined1 local_a10 [16];
  undefined1 *local_a00 [2];
  undefined1 local_9f0 [16];
  undefined1 *local_9e0 [2];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0 [2];
  undefined1 local_9b0 [16];
  undefined1 *local_9a0 [2];
  undefined1 local_990 [16];
  undefined1 *local_980 [2];
  undefined1 local_970 [16];
  undefined1 *local_960 [2];
  undefined1 local_950 [16];
  undefined1 *local_940 [2];
  undefined1 local_930 [16];
  undefined1 *local_920 [2];
  undefined1 local_910 [16];
  undefined1 *local_900 [2];
  undefined1 local_8f0 [16];
  undefined1 *local_8e0 [2];
  undefined1 local_8d0 [16];
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  undefined1 *local_8a0 [2];
  undefined1 local_890 [16];
  undefined1 *local_880 [2];
  undefined1 local_870 [16];
  undefined1 *local_860 [2];
  undefined1 local_850 [16];
  vector<MultisigTestVector,_std::allocator<MultisigTestVector>_> local_840;
  Pubkey local_828;
  Pubkey local_810;
  Pubkey local_7f8;
  undefined1 local_7e0 [72];
  Pubkey local_798;
  Pubkey local_780;
  Pubkey local_768;
  Pubkey local_750;
  Pubkey local_738;
  Pubkey local_720;
  Pubkey local_708;
  Pubkey local_6f0;
  Pubkey local_6d8;
  Pubkey local_6c0;
  Pubkey local_6a8;
  Pubkey local_690;
  undefined1 local_678 [88];
  _Alloc_hider local_620;
  char local_610 [16];
  bool local_600;
  undefined4 local_5f8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_5f0;
  Script local_5d8;
  undefined1 *local_5a0 [2];
  undefined1 local_590 [16];
  undefined1 local_580;
  undefined4 local_578;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_570;
  Script local_558;
  undefined1 *local_520 [2];
  undefined1 local_510 [16];
  undefined1 local_500;
  undefined4 local_4f8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_4f0;
  Script local_4d8;
  undefined1 *local_4a0 [2];
  undefined1 local_490 [16];
  undefined1 local_480;
  undefined4 local_478;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_470;
  Script local_458;
  undefined1 *local_420 [2];
  undefined1 local_410 [16];
  undefined1 local_400;
  undefined4 local_3f8;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_3f0;
  Script local_3d8;
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined1 local_380;
  undefined1 local_378 [24];
  Pubkey local_360;
  Pubkey local_348;
  Pubkey local_330;
  Pubkey local_318;
  Pubkey local_300;
  Pubkey local_2e8;
  Pubkey local_2d0;
  Pubkey local_2b8;
  Pubkey local_2a0;
  Pubkey local_288;
  Pubkey local_270;
  Pubkey local_258;
  Pubkey local_240;
  Pubkey local_228;
  undefined1 local_210 [72];
  Pubkey local_1c8;
  Pubkey local_1b0;
  Pubkey local_198;
  Pubkey local_180;
  Pubkey local_168;
  Pubkey local_150;
  Pubkey local_138;
  Pubkey local_120;
  Pubkey local_108;
  Pubkey local_f0;
  Pubkey local_d8;
  Pubkey local_c0;
  Pubkey local_a8;
  Pubkey local_90;
  Pubkey local_78;
  Pubkey local_60;
  Pubkey local_48;
  
  local_678._0_4_ = 1;
  local_860[0] = local_850;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_860,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_828,(string *)local_860);
  __l._M_len = 1;
  __l._M_array = &local_828;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_678 + 8),__l,
             &local_1049);
  local_880[0] = local_870;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_880,
             "512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae","");
  cfd::core::Script::Script((Script *)(local_678 + 0x20),(string *)local_880);
  local_620._M_p = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"");
  local_600 = false;
  local_5f8 = 1;
  local_8a0[0] = local_890;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8a0,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_810,(string *)local_8a0);
  local_8c0[0] = local_8b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8c0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey(&local_7f8,(string *)local_8c0);
  __l_00._M_len = 2;
  __l_00._M_array = &local_810;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_5f0,__l_00,&local_104a);
  local_8e0[0] = local_8d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_8e0,
             "512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"
             ,"");
  cfd::core::Script::Script(&local_5d8,(string *)local_8e0);
  local_5a0[0] = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"");
  local_580 = 0;
  local_578 = 2;
  local_900[0] = local_8f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_900,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey(&local_1048,(string *)local_900);
  local_920[0] = local_910;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_920,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey(&local_1030,(string *)local_920);
  local_940[0] = local_930;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_940,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey(&local_1018,(string *)local_940);
  __l_01._M_len = 3;
  __l_01._M_array = &local_1048;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_570,__l_01,&local_104b);
  local_960[0] = local_950;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_960,
             "522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"
             ,"");
  cfd::core::Script::Script(&local_558,(string *)local_960);
  local_520[0] = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_520,"");
  local_500 = 0;
  local_4f8 = 0xc;
  local_980[0] = local_970;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_980,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_7e0,(string *)local_980);
  local_9a0[0] = local_990;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9a0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_7e0 + 0x18),(string *)local_9a0);
  local_9c0[0] = local_9b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9c0,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_7e0 + 0x30),(string *)local_9c0);
  local_9e0[0] = local_9d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_9e0,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_798,(string *)local_9e0);
  local_a00[0] = local_9f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a00,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_780,(string *)local_a00);
  local_a20[0] = local_a10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a20,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_768,(string *)local_a20);
  local_a40[0] = local_a30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a40,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_750,(string *)local_a40);
  local_a60[0] = local_a50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a60,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_738,(string *)local_a60);
  local_a80[0] = local_a70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a80,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_720,(string *)local_a80);
  local_aa0[0] = local_a90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_aa0,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_708,(string *)local_aa0);
  local_ac0[0] = local_ab0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ac0,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_6f0,(string *)local_ac0);
  local_ae0[0] = local_ad0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ae0,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_6d8,(string *)local_ae0);
  local_b00[0] = local_af0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b00,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_6c0,(string *)local_b00);
  local_b20[0] = local_b10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b20,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_6a8,(string *)local_b20);
  local_b40[0] = local_b30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b40,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_690,(string *)local_b40);
  __l_02._M_len = 0xf;
  __l_02._M_array = (iterator)local_7e0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_4f0,__l_02,&local_104c);
  local_b60[0] = local_b50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b60,
             "5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,"");
  cfd::core::Script::Script(&local_4d8,(string *)local_b60);
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"");
  local_480 = 0;
  local_478 = 0xf;
  local_b80[0] = local_b70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b80,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_378,(string *)local_b80);
  local_ba0[0] = local_b90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ba0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey(&local_360,(string *)local_ba0);
  local_bc0[0] = local_bb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_bc0,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey(&local_348,(string *)local_bc0);
  local_be0[0] = local_bd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_be0,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_330,(string *)local_be0);
  local_c00[0] = local_bf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c00,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_318,(string *)local_c00);
  local_c20[0] = local_c10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c20,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_300,(string *)local_c20);
  local_c40[0] = local_c30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c40,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_2e8,(string *)local_c40);
  local_c60[0] = local_c50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c60,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_2d0,(string *)local_c60);
  local_c80[0] = local_c70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c80,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_2b8,(string *)local_c80);
  local_ca0[0] = local_c90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ca0,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_2a0,(string *)local_ca0);
  local_cc0[0] = local_cb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc0,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_288,(string *)local_cc0);
  local_ce0[0] = local_cd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ce0,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_270,(string *)local_ce0);
  local_d00[0] = local_cf0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d00,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_258,(string *)local_d00);
  local_d20[0] = local_d10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d20,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_240,(string *)local_d20);
  local_d40[0] = local_d30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d40,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_228,(string *)local_d40);
  __l_03._M_len = 0xf;
  __l_03._M_array = (iterator)local_378;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_470,__l_03,&local_104d);
  local_d60[0] = local_d50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d60,
             "5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"
             ,"");
  cfd::core::Script::Script(&local_458,(string *)local_d60);
  local_420[0] = local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_420,"");
  local_400 = 0;
  local_3f8 = 0x14;
  local_d80[0] = local_d70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d80,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0","");
  cfd::core::Pubkey::Pubkey((Pubkey *)local_210,(string *)local_d80);
  local_da0[0] = local_d90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_da0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_210 + 0x18),(string *)local_da0);
  local_dc0[0] = local_db0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_dc0,
             "024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_210 + 0x30),(string *)local_dc0);
  local_de0[0] = local_dd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_de0,
             "03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38","");
  cfd::core::Pubkey::Pubkey(&local_1c8,(string *)local_de0);
  local_e00[0] = local_df0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e00,
             "020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1","");
  cfd::core::Pubkey::Pubkey(&local_1b0,(string *)local_e00);
  local_e20[0] = local_e10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e20,
             "0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147","");
  cfd::core::Pubkey::Pubkey(&local_198,(string *)local_e20);
  local_e40[0] = local_e30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e40,
             "0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c","");
  cfd::core::Pubkey::Pubkey(&local_180,(string *)local_e40);
  local_e60[0] = local_e50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e60,
             "020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9","");
  cfd::core::Pubkey::Pubkey(&local_168,(string *)local_e60);
  local_e80[0] = local_e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e80,
             "0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37","");
  cfd::core::Pubkey::Pubkey(&local_150,(string *)local_e80);
  local_ea0[0] = local_e90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ea0,
             "0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e","");
  cfd::core::Pubkey::Pubkey(&local_138,(string *)local_ea0);
  local_ec0[0] = local_eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ec0,
             "03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b","");
  cfd::core::Pubkey::Pubkey(&local_120,(string *)local_ec0);
  local_ee0[0] = local_ed0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ee0,
             "02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd","");
  cfd::core::Pubkey::Pubkey(&local_108,(string *)local_ee0);
  local_f00[0] = local_ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f00,
             "0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d","");
  cfd::core::Pubkey::Pubkey(&local_f0,(string *)local_f00);
  local_f20[0] = local_f10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f20,
             "0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2","");
  cfd::core::Pubkey::Pubkey(&local_d8,(string *)local_f20);
  local_f40[0] = local_f30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f40,
             "025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db","");
  cfd::core::Pubkey::Pubkey(&local_c0,(string *)local_f40);
  local_f60[0] = local_f50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f60,
             "030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55","");
  cfd::core::Pubkey::Pubkey(&local_a8,(string *)local_f60);
  local_f80[0] = local_f70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f80,
             "0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e","");
  cfd::core::Pubkey::Pubkey(&local_90,(string *)local_f80);
  local_fa0[0] = local_f90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fa0,
             "02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8","");
  cfd::core::Pubkey::Pubkey(&local_78,(string *)local_fa0);
  local_fc0[0] = local_fb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fc0,
             "03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950","");
  cfd::core::Pubkey::Pubkey(&local_60,(string *)local_fc0);
  local_fe0[0] = local_fd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_fe0,
             "024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561","");
  cfd::core::Pubkey::Pubkey(&local_48,(string *)local_fe0);
  __l_04._M_len = 0x14;
  __l_04._M_array = (iterator)local_210;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_3f0,__l_04,&local_104e);
  local_1000[0] = local_ff0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1000,
             "01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"
             ,"");
  cfd::core::Script::Script(&local_3d8,(string *)local_1000);
  puVar5 = local_390;
  local_3a0[0] = puVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"");
  local_380 = 1;
  __l_05._M_len = 6;
  __l_05._M_array = (iterator)local_678;
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::vector
            (&local_840,__l_05,&local_104f);
  lVar4 = -0x300;
  do {
    if (puVar5 != *(undefined1 **)(puVar5 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x10));
    }
    cfd::core::Script::~Script((Script *)(puVar5 + -0x48));
    std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
              ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(puVar5 + -0x60));
    puVar5 = puVar5 + -0x80;
    lVar4 = lVar4 + 0x80;
  } while (lVar4 != 0);
  if (local_1000[0] != local_ff0) {
    operator_delete(local_1000[0]);
  }
  lVar4 = 0x1c8;
  do {
    if (*(void **)(local_210 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_210 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if (local_fe0[0] != local_fd0) {
    operator_delete(local_fe0[0]);
  }
  if (local_fc0[0] != local_fb0) {
    operator_delete(local_fc0[0]);
  }
  if (local_fa0[0] != local_f90) {
    operator_delete(local_fa0[0]);
  }
  if (local_f80[0] != local_f70) {
    operator_delete(local_f80[0]);
  }
  if (local_f60[0] != local_f50) {
    operator_delete(local_f60[0]);
  }
  if (local_f40[0] != local_f30) {
    operator_delete(local_f40[0]);
  }
  if (local_f20[0] != local_f10) {
    operator_delete(local_f20[0]);
  }
  if (local_f00[0] != local_ef0) {
    operator_delete(local_f00[0]);
  }
  if (local_ee0[0] != local_ed0) {
    operator_delete(local_ee0[0]);
  }
  if (local_ec0[0] != local_eb0) {
    operator_delete(local_ec0[0]);
  }
  if (local_ea0[0] != local_e90) {
    operator_delete(local_ea0[0]);
  }
  if (local_e80[0] != local_e70) {
    operator_delete(local_e80[0]);
  }
  if (local_e60[0] != local_e50) {
    operator_delete(local_e60[0]);
  }
  if (local_e40[0] != local_e30) {
    operator_delete(local_e40[0]);
  }
  if (local_e20[0] != local_e10) {
    operator_delete(local_e20[0]);
  }
  if (local_e00[0] != local_df0) {
    operator_delete(local_e00[0]);
  }
  if (local_de0[0] != local_dd0) {
    operator_delete(local_de0[0]);
  }
  if (local_dc0[0] != local_db0) {
    operator_delete(local_dc0[0]);
  }
  if (local_da0[0] != local_d90) {
    operator_delete(local_da0[0]);
  }
  if (local_d80[0] != local_d70) {
    operator_delete(local_d80[0]);
  }
  if (local_d60[0] != local_d50) {
    operator_delete(local_d60[0]);
  }
  lVar4 = 0x150;
  do {
    if (*(void **)(local_378 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_378 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if (local_d40[0] != local_d30) {
    operator_delete(local_d40[0]);
  }
  if (local_d20[0] != local_d10) {
    operator_delete(local_d20[0]);
  }
  if (local_d00[0] != local_cf0) {
    operator_delete(local_d00[0]);
  }
  if (local_ce0[0] != local_cd0) {
    operator_delete(local_ce0[0]);
  }
  if (local_cc0[0] != local_cb0) {
    operator_delete(local_cc0[0]);
  }
  if (local_ca0[0] != local_c90) {
    operator_delete(local_ca0[0]);
  }
  if (local_c80[0] != local_c70) {
    operator_delete(local_c80[0]);
  }
  if (local_c60[0] != local_c50) {
    operator_delete(local_c60[0]);
  }
  if (local_c40[0] != local_c30) {
    operator_delete(local_c40[0]);
  }
  if (local_c20[0] != local_c10) {
    operator_delete(local_c20[0]);
  }
  if (local_c00[0] != local_bf0) {
    operator_delete(local_c00[0]);
  }
  if (local_be0[0] != local_bd0) {
    operator_delete(local_be0[0]);
  }
  if (local_bc0[0] != local_bb0) {
    operator_delete(local_bc0[0]);
  }
  if (local_ba0[0] != local_b90) {
    operator_delete(local_ba0[0]);
  }
  if (local_b80[0] != local_b70) {
    operator_delete(local_b80[0]);
  }
  if (local_b60[0] != local_b50) {
    operator_delete(local_b60[0]);
  }
  lVar4 = 0x150;
  do {
    if (*(void **)(local_7e0 + lVar4) != (void *)0x0) {
      operator_delete(*(void **)(local_7e0 + lVar4));
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if (local_b40[0] != local_b30) {
    operator_delete(local_b40[0]);
  }
  if (local_b20[0] != local_b10) {
    operator_delete(local_b20[0]);
  }
  if (local_b00[0] != local_af0) {
    operator_delete(local_b00[0]);
  }
  if (local_ae0[0] != local_ad0) {
    operator_delete(local_ae0[0]);
  }
  if (local_ac0[0] != local_ab0) {
    operator_delete(local_ac0[0]);
  }
  if (local_aa0[0] != local_a90) {
    operator_delete(local_aa0[0]);
  }
  if (local_a80[0] != local_a70) {
    operator_delete(local_a80[0]);
  }
  if (local_a60[0] != local_a50) {
    operator_delete(local_a60[0]);
  }
  if (local_a40[0] != local_a30) {
    operator_delete(local_a40[0]);
  }
  if (local_a20[0] != local_a10) {
    operator_delete(local_a20[0]);
  }
  if (local_a00[0] != local_9f0) {
    operator_delete(local_a00[0]);
  }
  if (local_9e0[0] != local_9d0) {
    operator_delete(local_9e0[0]);
  }
  if (local_9c0[0] != local_9b0) {
    operator_delete(local_9c0[0]);
  }
  if (local_9a0[0] != local_990) {
    operator_delete(local_9a0[0]);
  }
  if (local_980[0] != local_970) {
    operator_delete(local_980[0]);
  }
  if (local_960[0] != local_950) {
    operator_delete(local_960[0]);
  }
  lVar4 = 0x30;
  do {
    pvVar1 = *(void **)((long)&local_1048.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if (local_940[0] != local_930) {
    operator_delete(local_940[0]);
  }
  if (local_920[0] != local_910) {
    operator_delete(local_920[0]);
  }
  if (local_900[0] != local_8f0) {
    operator_delete(local_900[0]);
  }
  if (local_8e0[0] != local_8d0) {
    operator_delete(local_8e0[0]);
  }
  lVar4 = 0x18;
  do {
    pvVar1 = *(void **)((long)&local_810.data_.data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if (local_8c0[0] != local_8b0) {
    operator_delete(local_8c0[0]);
  }
  if (local_8a0[0] != local_890) {
    operator_delete(local_8a0[0]);
  }
  if (local_880[0] != local_870) {
    operator_delete(local_880[0]);
  }
  if (local_828.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_828.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_860[0] != local_850) {
    operator_delete(local_860[0]);
  }
  cfd::core::Script::Script((Script *)local_210);
  if (local_840.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_840.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_678 + 8);
    pMVar6 = local_840.super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_678._0_4_ = pMVar6->req_sig;
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
                (this_00,&pMVar6->input_pubkeys);
      cfd::core::Script::Script((Script *)(local_678 + 0x20),&pMVar6->expect_multisig_script);
      local_620._M_p = local_610;
      pcVar2 = (pMVar6->expect_message)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_620,pcVar2,pcVar2 + (pMVar6->expect_message)._M_string_length);
      local_600 = pMVar6->is_witness;
      cfd::core::ScriptUtil::CreateMultisigRedeemScript
                ((uint)(Script *)local_7e0,(vector *)(ulong)(uint)local_678._0_4_,SUB81(this_00,0));
      cfd::core::Script::operator=((Script *)local_210,(Script *)local_7e0);
      cfd::core::Script::~Script((Script *)local_7e0);
      cfd::core::Script::GetHex_abi_cxx11_();
      lhs = local_7e0._0_8_;
      cfd::core::Script::GetHex_abi_cxx11_();
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1048,"actual.GetHex().c_str()",
                 "test_vector.expect_multisig_script.GetHex().c_str()",(char *)lhs,
                 (char *)local_378._0_8_);
      if ((AssertHelperData *)local_378._0_8_ != (AssertHelperData *)(local_378 + 0x10)) {
        operator_delete((void *)local_378._0_8_);
      }
      if ((undefined1 *)local_7e0._0_8_ != local_7e0 + 0x10) {
        operator_delete((void *)local_7e0._0_8_);
      }
      if (local_1048.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)local_7e0);
        message = "";
        if (local_1048.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          message = *(char **)local_1048.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_378,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptutil.cpp"
                   ,0x127,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_378,(Message *)local_7e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_378);
        if ((_func_int **)local_7e0._0_8_ != (_func_int **)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && ((_func_int **)local_7e0._0_8_ != (_func_int **)0x0)) {
            (**(code **)(*(_func_int **)local_7e0._0_8_ + 8))();
          }
          local_7e0._0_8_ = (_func_int **)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_1048.data_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (local_620._M_p != local_610) {
        operator_delete(local_620._M_p);
      }
      cfd::core::Script::~Script((Script *)(local_678 + 0x20));
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(this_00);
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != local_840.
                       super__Vector_base<MultisigTestVector,_std::allocator<MultisigTestVector>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  cfd::core::Script::~Script((Script *)local_210);
  std::vector<MultisigTestVector,_std::allocator<MultisigTestVector>_>::~vector(&local_840);
  return;
}

Assistant:

TEST(ScriptUtil, CreateMultisigRedeemScriptTest) {
  const std::vector<MultisigTestVector> test_vectors = {
    // 1-of-1 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a051ae"),
      "",
      false
    },
    // 1-of-2 Multisig
    {
      1,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      },
      Script("512102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c52ae"),
      "",
      false
    },
    // 2-of-3 Multisig
    {
      2,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
      },
      Script("522102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b8253ae"),
      "",
      false
    },
    // 12-of-15 Multisig
    {
      12,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5c2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 15-of-15 Multisig
    {
      15,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
      },
      Script("5f2102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db5fae"),
      "",
      false
    },
    // 20-of-20 Multisig on witness
    {
      20,
      {
        Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
        Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
        Pubkey("024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b82"),
        Pubkey("03ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb38"),
        Pubkey("020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1"),
        Pubkey("0289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147"),
        Pubkey("0210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c"),
        Pubkey("020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9"),
        Pubkey("0289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37"),
        Pubkey("0254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e"),
        Pubkey("03a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b"),
        Pubkey("02ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd"),
        Pubkey("0289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d"),
        Pubkey("0396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd2"),
        Pubkey("025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db"),
        Pubkey("030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55"),
        Pubkey("0267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e"),
        Pubkey("02f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b8"),
        Pubkey("03968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb5950"),
        Pubkey("024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd2561"),
      },
      Script("01142102522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0210340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c21024a3477bc8b933a320eb5667ee72c35a81aa155c8e20cc51c65fb666de3a43b822103ce982e13798960b7c23fd2c1676f64ff6df80f75324d0e566432e2a884dafb3821020bac40bcc23dd9b33a32b8183d2e9e79eb976bcfb2247141da1e58b2970bfde1210289d8f0fb8cbd369a9aad28070edf2e99544384c122b8af825e50ea219193f147210210fcaf81018c3f304ca792c9c1809ec00b159e23ebde669486c62787818f315c21020847e443a4d6b9ea577b776ca232c5dc9a3cbbd6c82dde0ef5100ac6c5a36cf9210289e210d82121823dc5af09a0ab8c23d4a52273358295f4e4596b0f98e4973e37210254de5471d6c8b36c26a62e0b54385fe0e88563e34127c18e97e705f83172326e2103a9c473d65af0420e600e085be058f98ac0634d13390e5d8d4962cbcfeb75422b2102ebcde0a7ece63e607287af1542efddeb008b0d1693da2ca06b622ebaf92051dd210289b2b5852ffd7b89266338d746e05e7afe33e6005dab198b6a4b13065b93a89d210396436fd20f3c5d3638c8ed4195cf63b4467701c5d4de660bd9bced68f4588cd221025dffce0b5e131808a630d0d8769d22ead71fddf336836916c5906676e13394db21030023121bed4585fdfea023aee4c7f9731e3cfa6b2a8ec21a159615d2bad57e55210267a49281bd9d6d366c39c62f2e95a2aab37638f2a4718891c542d0961962644e2102f48e8e2bcaeb16a6d781bb7a72f6250607bf21e32f08c48e37a9e4706e6d48b82103968ac57888ddaa3b57caa39efd5d5382c24f3deed602775cd4895f7c7adb595021024b64115bff6cc3718867114f7594fad535344f27ebe17ffa0e66288eb7bd25610114ae"),
      "",
      true
    },
  };

  Script actual;
  for (MultisigTestVector test_vector : test_vectors) {
    try {
      actual = ScriptUtil::CreateMultisigRedeemScript(
          test_vector.req_sig, test_vector.input_pubkeys,
          test_vector.is_witness);
      EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_multisig_script.GetHex().c_str());
    } catch (const CfdException& except) {
      EXPECT_STREQ(except.what(), "");
      EXPECT_EQ(test_vector.req_sig, 0);
    }
  }
}